

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O2

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  uint uVar1;
  uint32_t uVar2;
  byte *pbVar3;
  
  uVar2 = 10;
  while( true ) {
    pbVar3 = (byte *)mode + 1;
    if (*mode == 0) break;
    uVar1 = (uint)(byte)*mode;
    mode = (char *)pbVar3;
    if ((uVar1 == 0x66) || (uVar1 == 0x6c)) {
      *(uint *)((ulong)(L->glref).ptr32 + 0xc64) = uVar1;
      lj_trace_flushall(L);
    }
    else if (uVar1 == 0x69) {
      uVar2 = 0;
      for (; (byte)(*pbVar3 - 0x30) < 10; pbVar3 = pbVar3 + 1) {
        uVar2 = (uint)(byte)(*pbVar3 - 0x30) + uVar2 * 10;
      }
      mode = (char *)pbVar3;
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
    }
  }
  if ((profile_state.g != (global_State *)0x0) &&
     (luaJIT_profile_stop(L), profile_state.g != (global_State *)0x0)) {
    return;
  }
  profile_state.g = (global_State *)(ulong)(L->glref).ptr32;
  profile_state.samples = 0;
  profile_state.sb.L.ptr32 = (uint32_t)L;
  profile_state.sb.p.ptr32 = 0;
  profile_state.sb.e.ptr32 = 0;
  profile_state.sb.b.ptr32 = 0;
  profile_state.timer.opt.handler = profile_handler;
  profile_state.cb = cb;
  profile_state.data = data;
  profile_state.timer.opt.interval_msec = uVar2;
  lj_profile_timer_start(&profile_state.timer);
  return;
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  ps->timer.opt.interval_msec = interval;
  ps->timer.opt.handler = profile_handler;
  lj_profile_timer_start(&ps->timer);
}